

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_container.cpp
# Opt level: O1

bool __thiscall
cppnet::TimerContainer::AddTimer
          (TimerContainer *this,weak_ptr<cppnet::TimerSlot> *t,uint32_t time,bool always)

{
  _Atomic_word *p_Var1;
  int iVar2;
  TimerSlot *this_00;
  element_type *peVar3;
  undefined1 uVar4;
  int iVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar6;
  shared_ptr<cppnet::TimerSlot> local_58;
  TimerSlot *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  
  if (this->_timer_max <= time) {
    return false;
  }
  this_01 = (t->super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar5 = this_01->_M_use_count;
    do {
      if (iVar5 == 0) {
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar2 = this_01->_M_use_count;
      bVar6 = iVar5 == iVar2;
      if (bVar6) {
        this_01->_M_use_count = iVar5 + 1;
        iVar2 = iVar5;
      }
      iVar5 = iVar2;
      UNLOCK();
    } while (!bVar6);
  }
  if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar6 = true;
  }
  else {
    bVar6 = this_01->_M_use_count == 0;
  }
  this_00 = (t->super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (!(bool)(this_00 == (TimerSlot *)0x0 | bVar6)) {
    if ((time < this->_time_unit) &&
       (peVar3 = (this->_sub_timer).
                 super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
       peVar3 != (element_type *)0x0)) {
      local_40 = (t->super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                 _M_pi;
      if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_40->_M_weak_count = local_40->_M_weak_count + 1;
          UNLOCK();
        }
        else {
          local_40->_M_weak_count = local_40->_M_weak_count + 1;
        }
      }
      local_48 = this_00;
      iVar5 = (**(peVar3->super_Timer)._vptr_Timer)(peVar3,&local_48,(ulong)time,(ulong)always);
      uVar4 = (undefined1)iVar5;
      if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &local_40->_M_weak_count;
          iVar5 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar5 = local_40->_M_weak_count;
          local_40->_M_weak_count = iVar5 + -1;
        }
        if (iVar5 == 1) {
          (*local_40->_vptr__Sp_counted_base[3])();
        }
      }
      goto LAB_001133dd;
    }
    bVar6 = TimerSlot::IsInTimer(this_00);
    if (!bVar6) {
      TimerSlot::SetInterval(this_00,time);
      TimerSlot::SetInTimer(this_00);
      if (always) {
        TimerSlot::SetAlways(this_00);
      }
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      local_58.super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
      local_58.super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           this_01;
      uVar4 = InnerAddTimer(this,&local_58,time);
      if (local_58.super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      goto LAB_001133dd;
    }
  }
  uVar4 = 0;
LAB_001133dd:
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return (bool)uVar4;
}

Assistant:

bool TimerContainer::AddTimer(std::weak_ptr<TimerSlot> t, uint32_t time, bool always) {
    if (time >= _timer_max) {
        return false;
    }

    auto ptr = t.lock();
    if (!ptr) {
        return false;
    }

    if (time < _time_unit && _sub_timer) {
        return _sub_timer->AddTimer(t, time, always);
    }

    // set current timer unit interval
    if (!ptr->IsInTimer()) {
        ptr->SetInterval(time);
        ptr->SetInTimer();
        if (always) {
            ptr->SetAlways();
        }

    } else {
        return false;
    }

    return InnerAddTimer(ptr, time);
}